

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O2

int write_s98v3(s98c *ctx,FILE *fp)

{
  s98deviceinfo *psVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  iVar3 = (ctx->header).device_count * 0x10;
  iVar6 = (int)ctx->dump_buffer;
  iVar2 = (int)ctx->p - iVar6;
  uVar7 = 0;
  uVar4 = iVar3 + 0x20 + iVar2;
  if (ctx->tags_count == 0) {
    uVar4 = 0;
  }
  uVar5 = iVar3 + 0x20 + ((int)ctx->loop_start - iVar6);
  if (ctx->loop_start == (uint8_t *)0x0) {
    uVar5 = 0;
  }
  iVar6 = (int)ctx->dump_start - iVar6;
  if (ctx->dump_start == (uint8_t *)0x0) {
    iVar6 = 0;
  }
  (ctx->header).offset_to_tag = uVar4;
  (ctx->header).offset_to_dump = iVar3 + iVar6 + 0x20;
  (ctx->header).offset_to_loop = uVar5;
  fwrite("S98",1,3,(FILE *)fp);
  fputc((ctx->header).version + 0x30,(FILE *)fp);
  write_dword(fp,(ctx->header).timer_numerator);
  write_dword(fp,(ctx->header).timer_denominator);
  write_dword(fp,0);
  write_dword(fp,(ctx->header).offset_to_tag);
  write_dword(fp,(ctx->header).offset_to_dump);
  write_dword(fp,(ctx->header).offset_to_loop);
  write_dword(fp,(ctx->header).device_count);
  lVar8 = 0xc;
  for (; uVar7 < (ctx->header).device_count; uVar7 = uVar7 + 1) {
    psVar1 = ctx->devices;
    write_dword(fp,*(uint32_t *)((long)psVar1 + lVar8 + -0xc));
    write_dword(fp,*(uint32_t *)((long)psVar1 + lVar8 + -8));
    write_dword(fp,*(uint32_t *)((long)psVar1 + lVar8 + -4));
    write_dword(fp,*(uint32_t *)((long)&psVar1->device + lVar8));
    lVar8 = lVar8 + 0x10;
  }
  fwrite(ctx->dump_buffer,1,(long)iVar2,(FILE *)fp);
  write_s98v3_tags(ctx,fp);
  return 0;
}

Assistant:

int write_s98v3(struct s98c* ctx, FILE* fp)
{
    int header_size = 0x20; 
    int devices_size = sizeof(struct s98deviceinfo) * ctx->header.device_count;
    int dump_offset = header_size + devices_size;
    int loop_offset = 0;
    int dump_length = ctx->p - ctx->dump_buffer;
    int tag_offset = (ctx->tags_count == 0) ? 0 : dump_offset + dump_length;

    if(ctx->loop_start != NULL) {
        loop_offset = dump_offset + (ctx->loop_start - ctx->dump_buffer);
    }
    if(ctx->dump_start != NULL) {
        dump_offset += (ctx->dump_start - ctx->dump_buffer);
    }
    ctx->header.offset_to_tag = tag_offset;
    ctx->header.offset_to_dump = dump_offset;
    ctx->header.offset_to_loop = loop_offset;

    fwrite("S98", 1, 3, fp); // 0
    fputc('0' + ctx->header.version, fp); // 3
    write_dword(fp, ctx->header.timer_numerator); // 4
    write_dword(fp, ctx->header.timer_denominator); // 8
    write_dword(fp, 0); // c
    write_dword(fp, ctx->header.offset_to_tag); // 10 
    write_dword(fp, ctx->header.offset_to_dump); //14
    write_dword(fp, ctx->header.offset_to_loop); //18
    write_dword(fp, ctx->header.device_count);

    int i;
    for(i = 0; i < ctx->header.device_count; i++) {
        struct s98deviceinfo* info = ctx->devices + i;

        write_dword(fp, info->device);
        write_dword(fp, info->clock);
        write_dword(fp, info->panpot);
        write_dword(fp, info->reserved);
    }
    
    fwrite(ctx->dump_buffer, 1, dump_length, fp);
    write_s98v3_tags(ctx, fp);

    return 0;
}